

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_group_delay.cc
# Opt level: O2

bool __thiscall
sptk::FilterCoefficientsToGroupDelay::Run
          (FilterCoefficientsToGroupDelay *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *group_delay,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double __y;
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  uint uVar5;
  double *pdVar6;
  pointer pdVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  size_type sVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pdVar14;
  double dVar15;
  double dVar16;
  double __x;
  
  if ((this->is_valid_ == true) &&
     ((long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 == (long)this->num_numerator_order_ + 1)) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (group_delay == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if ((long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3 !=
        (long)this->num_denominator_order_ + 1) {
      return false;
    }
    iVar8 = this->fft_length_;
    uVar5 = iVar8 / 2 + 1;
    if ((long)(group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)(int)uVar5) {
      std::vector<double,_std::allocator<double>_>::resize(group_delay,(long)(int)uVar5);
      iVar8 = this->fft_length_;
    }
    this_00 = &buffer->real_part1_;
    sVar11 = (size_type)iVar8;
    if ((long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,sVar11);
      sVar11 = (size_type)this->fft_length_;
    }
    this_02 = &buffer->real_part2_;
    if ((long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(this_02,sVar11);
    }
    this_01 = &buffer->flipped_coefficients_;
    pdVar6 = (buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar11 = (long)this->num_denominator_order_ + 1;
    if ((long)(buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6 >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,sVar11);
      pdVar6 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar7 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
             .super__Vector_impl_data._M_start;
    for (pdVar14 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish; pdVar14 != pdVar7 + 1;
        pdVar14 = pdVar14 + -1) {
      *pdVar6 = pdVar14[-1];
      pdVar6 = pdVar6 + 1;
    }
    (buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = 1.0;
    bVar4 = Perform1DConvolution(numerator_coefficients,this_01,&buffer->convolved_coefficients_);
    if (bVar4) {
      pdVar7 = (buffer->convolved_coefficients_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (buffer->convolved_coefficients_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      uVar9 = (ulong)((long)pdVar14 - (long)pdVar7) >> 3;
      uVar13 = (long)pdVar14 - (long)pdVar7;
      if (uVar13 != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar7,uVar13);
      }
      pdVar7 = (buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar14 = (pointer)(((long)(uVar13 * 0x20000000) >> 0x1d) +
                              (long)(buffer->real_part1_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start); pdVar14 != pdVar7;
          pdVar14 = pdVar14 + 1) {
        *pdVar14 = 0.0;
      }
      pdVar14 = (buffer->convolved_coefficients_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar7 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = 0;
      uVar10 = uVar9 & 0xffffffff;
      if ((int)uVar9 < 1) {
        uVar10 = uVar12;
      }
      for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        pdVar7[uVar12] = (double)(int)uVar12 * pdVar14[uVar12];
      }
      pdVar14 = (buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pdVar7 = pdVar7 + (int)(uVar13 >> 3); pdVar7 != pdVar14; pdVar7 = pdVar7 + 1) {
        *pdVar7 = 0.0;
      }
      bVar4 = RealValuedFastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,&buffer->imag_part1_,
                         &buffer->buffer_for_fast_fourier_transform_);
      if (bVar4) {
        bVar4 = RealValuedFastFourierTransform::Run
                          (&this->fast_fourier_transform_,this_02,&buffer->imag_part2_,
                           &buffer->buffer_for_fast_fourier_transform_);
        uVar9 = 0;
        if (!bVar4) {
          return false;
        }
        pdVar7 = (group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar14 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar1 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (buffer->imag_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar13 = uVar9;
        }
        pdVar3 = (buffer->imag_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (; uVar13 != uVar9; uVar9 = uVar9 + 1) {
          dVar16 = pdVar14[uVar9];
          dVar15 = pdVar2[uVar9];
          __x = dVar16 * dVar16 + dVar15 * dVar15;
          __y = this->gamma_;
          if ((__y != 1.0) || (NAN(__y))) {
            __x = pow(__x,__y);
            dVar16 = pdVar14[uVar9];
            dVar15 = pdVar2[uVar9];
          }
          dVar15 = (dVar16 * pdVar1[uVar9] + dVar15 * pdVar3[uVar9]) / __x -
                   (double)this->num_denominator_order_;
          pdVar7[uVar9] = dVar15;
          dVar16 = this->alpha_;
          if ((dVar16 != 1.0) || (NAN(dVar16))) {
            if (dVar15 <= 0.0) {
              dVar16 = pow(-dVar15,dVar16);
              dVar16 = -dVar16;
            }
            else {
              dVar16 = pow(dVar15,dVar16);
            }
            pdVar7[uVar9] = dVar16;
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToGroupDelay::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* group_delay,
    FilterCoefficientsToGroupDelay::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == group_delay || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (group_delay->size() != static_cast<std::size_t>(output_length)) {
    group_delay->resize(output_length);
  }
  if (buffer->real_part1_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part1_.resize(fft_length_);
  }
  if (buffer->real_part2_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part2_.resize(fft_length_);
  }
  if (buffer->flipped_coefficients_.size() !=
      static_cast<std::size_t>(num_denominator_order_ + 1)) {
    buffer->flipped_coefficients_.resize(num_denominator_order_ + 1);
  }

  std::reverse_copy(denominator_coefficients.begin() + 1,
                    denominator_coefficients.end(),
                    buffer->flipped_coefficients_.begin());
  buffer->flipped_coefficients_.back() = 1.0;

  if (!Perform1DConvolution(numerator_coefficients,
                            buffer->flipped_coefficients_,
                            &buffer->convolved_coefficients_)) {
    return false;
  }
  const int coefficients_length(
      static_cast<int>(buffer->convolved_coefficients_.size()));

  std::copy(buffer->convolved_coefficients_.begin(),
            buffer->convolved_coefficients_.end(), buffer->real_part1_.begin());
  std::fill(buffer->real_part1_.begin() + coefficients_length,
            buffer->real_part1_.end(), 0.0);

  // Make ramped polynomial.
  {
    const double* src(&buffer->convolved_coefficients_[0]);
    double* dst(&buffer->real_part2_[0]);
    for (int i(0); i < coefficients_length; ++i) {
      dst[i] = i * src[i];
    }
  }
  std::fill(buffer->real_part2_.begin() + coefficients_length,
            buffer->real_part2_.end(), 0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part1_, &buffer->imag_part1_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  if (!fast_fourier_transform_.Run(
          &buffer->real_part2_, &buffer->imag_part2_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  double* output(&((*group_delay)[0]));
  const double* xr(&buffer->real_part1_[0]);
  const double* yr(&buffer->real_part2_[0]);
  const double* xi(&buffer->imag_part1_[0]);
  const double* yi(&buffer->imag_part2_[0]);

  for (int i(0); i < output_length; ++i) {
    double denominator(xr[i] * xr[i] + xi[i] * xi[i]);
    if (1.0 != gamma_) {
      denominator = std::pow(denominator, gamma_);
    }
    double numerator(xr[i] * yr[i] + xi[i] * yi[i]);
    output[i] = numerator / denominator - num_denominator_order_;
    if (1.0 != alpha_) {
      output[i] = (0.0 < output[i]) ? std::pow(output[i], alpha_)
                                    : -std::pow(-output[i], alpha_);
    }
  }

  return true;
}